

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O0

uint32_t rest_rpc::MD5::MD5CE::CalcF(uint32_t i,uint32_t b,uint32_t c,uint32_t d)

{
  uint32_t d_local;
  uint32_t c_local;
  uint32_t b_local;
  uint32_t i_local;
  undefined4 local_4;
  
  if (i < 0x10) {
    local_4 = d ^ b & (c ^ d);
  }
  else if (i < 0x20) {
    local_4 = c ^ d & (b ^ c);
  }
  else if (i < 0x30) {
    local_4 = b ^ c ^ d;
  }
  else {
    local_4 = c ^ (b | d ^ 0xffffffff);
  }
  return local_4;
}

Assistant:

static uint32_t CalcF(const uint32_t i, const uint32_t b, const uint32_t c,
                        const uint32_t d) {
    //    DCHECK_LT(i, 64u);
    if (i < 16) {
      return d ^ (b & (c ^ d));
    } else if (i < 32) {
      return c ^ (d & (b ^ c));
    } else if (i < 48) {
      return b ^ c ^ d;
    } else {
      return c ^ (b | (~d));
    }
  }